

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateIntegerLiteral(ExpressionTranslateContext *ctx,ExprIntegerLiteral *expression)

{
  bool bVar1;
  ExprIntegerLiteral *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if ((expression->super_ExprBase).type == ctx->ctx->typeShort) {
    Print(ctx,"((short)%d)",(ulong)(uint)(int)(short)expression->value);
  }
  else if ((expression->super_ExprBase).type == ctx->ctx->typeInt) {
    Print(ctx,"%d",expression->value & 0xffffffff);
  }
  else if ((expression->super_ExprBase).type == ctx->ctx->typeLong) {
    Print(ctx,"%lldll",expression->value);
  }
  else {
    bVar1 = isType<TypeEnum>((expression->super_ExprBase).type);
    if (!bVar1) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x1fc,
                    "void TranslateIntegerLiteral(ExpressionTranslateContext &, ExprIntegerLiteral *)"
                   );
    }
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,"(%d)",expression->value & 0xffffffff);
  }
  return;
}

Assistant:

void TranslateIntegerLiteral(ExpressionTranslateContext &ctx, ExprIntegerLiteral *expression)
{
	if(expression->type == ctx.ctx.typeShort)
	{
		Print(ctx, "((short)%d)", short(expression->value));
	}
	else if(expression->type == ctx.ctx.typeInt)
	{
		Print(ctx, "%d", int(expression->value));
	}
	else if(expression->type == ctx.ctx.typeLong)
	{
		Print(ctx, "%lldll", expression->value);
	}
	else if(isType<TypeEnum>(expression->type))
	{
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "(%d)", int(expression->value));
	}
	else
	{
		assert(!"unknown type");
	}
}